

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

iterator __thiscall
GF2::MI<137ul,GF2::MOGrlex<137ul>>::Insert<137ul,GF2::MOGrlex<137ul>>
          (MI<137ul,GF2::MOGrlex<137ul>> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *polyRight)

{
  bool bVar1;
  iterator pos;
  iterator local_38;
  _List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> local_30;
  
  local_38._M_node = (_List_node_base *)0x0;
  bVar1 = MI<137UL,_GF2::MOGrlex<137UL>_>::Find
                    ((MI<137UL,_GF2::MOGrlex<137UL>_> *)this,polyRight,&local_38);
  if (!bVar1) {
    local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._M_impl._M_node._M_size = 0;
    local_30._M_impl._M_node.super__List_node_base._M_prev =
         local_30._M_impl._M_node.super__List_node_base._M_next;
    local_38 = std::__cxx11::
               list<GF2::MP<137ul,GF2::MOGrlex<137ul>>,std::allocator<GF2::MP<137ul,GF2::MOGrlex<137ul>>>>
               ::emplace<GF2::MP<137ul,GF2::MOGrlex<137ul>>>
                         ((list<GF2::MP<137ul,GF2::MOGrlex<137ul>>,std::allocator<GF2::MP<137ul,GF2::MOGrlex<137ul>>>>
                           *)this,local_38._M_node,
                          (MP<137UL,_GF2::MOGrlex<137UL>_> *)
                          local_30._M_impl._M_node.super__List_node_base._M_next);
    MP<137UL,_GF2::MOGrlex<137UL>_>::operator=
              ((MP<137UL,_GF2::MOGrlex<137UL>_> *)(local_38._M_node + 1),polyRight);
    std::__cxx11::_List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::_M_clear(&local_30);
  }
  return (iterator)local_38._M_node;
}

Assistant:

iterator Insert(const MP<_m, _O1>& polyRight)
	{	
		assert(!polyRight.IsEmpty());
		iterator pos;
		if (!Find(polyRight, pos))
			*(pos = insert(pos, MP<_n, _O>(_order))) = polyRight;
		return pos;
	}